

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# servak.cpp
# Opt level: O0

string * path_cat_abi_cxx11_(string *__return_storage_ptr__,string_view base,string_view path)

{
  bool bVar1;
  char *pcVar2;
  const_pointer pcVar3;
  undefined1 auStack_30 [6];
  char path_separator;
  string_view path_local;
  string_view base_local;
  string *result;
  
  path_local.ptr_ = (char *)path.len_;
  _auStack_30 = path.ptr_;
  path_local.len_ = (size_t)base.ptr_;
  bVar1 = boost::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&path_local.len_);
  if (bVar1) {
    boost::basic_string_view::operator_cast_to_string
              (__return_storage_ptr__,(basic_string_view *)auStack_30);
  }
  else {
    boost::basic_string_view::operator_cast_to_string
              (__return_storage_ptr__,(basic_string_view *)&path_local.len_);
    pcVar2 = (char *)std::__cxx11::string::back();
    if (*pcVar2 == '/') {
      std::__cxx11::string::size();
      std::__cxx11::string::resize((ulong)__return_storage_ptr__);
    }
    pcVar3 = boost::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)auStack_30);
    boost::basic_string_view<char,_std::char_traits<char>_>::size
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_30);
    std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)pcVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
path_cat(
    beast::string_view base,
    beast::string_view path)
{
    if(base.empty())
        return std::string(path);
    std::string result(base);
#ifdef BOOST_MSVC
    char constexpr path_separator = '\\';
    if(result.back() == path_separator)
        result.resize(result.size() - 1);
    result.append(path.data(), path.size());
    for(auto& c : result)
        if(c == '/')
            c = path_separator;
#else
    char constexpr path_separator = '/';
    if(result.back() == path_separator)
        result.resize(result.size() - 1);
    result.append(path.data(), path.size());
#endif
    return result;
}